

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btCompoundLeafCallback::ProcessChildShape
          (btCompoundLeafCallback *this,btCollisionShape *childShape,int index)

{
  btTransform *pbVar1;
  btCollisionShape *pbVar2;
  btManifoldResult *pbVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  btCollisionObject *pbVar6;
  btCollisionObjectWrapper *pbVar7;
  long lVar8;
  long lStack_120;
  btCollisionObjectWrapper compoundWrap;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btVector3 aabbMax0;
  btVector3 aabbMin0;
  btTransform orgTrans;
  btTransform newChildWorldTrans;
  
  pbVar1 = this->m_compoundColObjWrap->m_worldTransform;
  orgTrans.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
  orgTrans.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
  orgTrans.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
  orgTrans.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
  orgTrans.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
  orgTrans.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
  orgTrans.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
  orgTrans.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2);
  lVar8 = (long)index;
  btTransform::operator*
            (&newChildWorldTrans,&orgTrans,
             (btTransform *)
             (lVar8 * 0x58 + (long)this->m_compoundColObjWrap->m_shape[1].m_userPointer));
  (*childShape->_vptr_btCollisionShape[2])(childShape,&newChildWorldTrans,&aabbMin0,&aabbMax0);
  pbVar2 = this->m_otherObjWrap->m_shape;
  (*pbVar2->_vptr_btCollisionShape[2])
            (pbVar2,this->m_otherObjWrap->m_worldTransform,&aabbMin1,&aabbMax1);
  if ((gCompoundChildShapePairCallback != (btShapePairCallback)0x0) &&
     (bVar4 = (*gCompoundChildShapePairCallback)(this->m_otherObjWrap->m_shape,childShape), !bVar4))
  {
    return;
  }
  bVar4 = TestAabbAgainstAabb2(&aabbMin0,&aabbMax0,&aabbMin1,&aabbMax1);
  if (bVar4) {
    compoundWrap.m_parent = this->m_compoundColObjWrap;
    pbVar6 = (compoundWrap.m_parent)->m_collisionObject;
    compoundWrap.m_partId = -1;
    compoundWrap.m_shape = childShape;
    compoundWrap.m_collisionObject = pbVar6;
    compoundWrap.m_worldTransform = &newChildWorldTrans;
    compoundWrap.m_index = index;
    if (this->m_childCollisionAlgorithms[lVar8] == (btCollisionAlgorithm *)0x0) {
      iVar5 = (*this->m_dispatcher->_vptr_btDispatcher[2])
                        (this->m_dispatcher,&compoundWrap,this->m_otherObjWrap,
                         this->m_sharedManifold);
      this->m_childCollisionAlgorithms[lVar8] = (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar5)
      ;
      pbVar6 = this->m_compoundColObjWrap->m_collisionObject;
    }
    pbVar3 = this->m_resultOut;
    pbVar7 = pbVar3->m_body0Wrap;
    if (pbVar7->m_collisionObject == pbVar6) {
      lStack_120 = 0x10;
    }
    else {
      pbVar7 = pbVar3->m_body1Wrap;
      lStack_120 = 0x18;
    }
    *(btCollisionObjectWrapper **)((long)&(pbVar3->super_Result)._vptr_Result + lStack_120) =
         &compoundWrap;
    (**(code **)((long)(pbVar3->super_Result)._vptr_Result + lStack_120))
              (pbVar3,0xffffffffffffffff,index);
    (*this->m_childCollisionAlgorithms[lVar8]->_vptr_btCollisionAlgorithm[2])
              (this->m_childCollisionAlgorithms[lVar8],&compoundWrap,this->m_otherObjWrap,
               this->m_dispatchInfo,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject !=
     this->m_compoundColObjWrap->m_collisionObject] = pbVar7;
  }
  return;
}

Assistant:

void	ProcessChildShape(const btCollisionShape* childShape,int index)
	{
		btAssert(index>=0);
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		btAssert(index<compoundShape->getNumChildShapes());


		//backup
		btTransform	orgTrans = m_compoundColObjWrap->getWorldTransform();
		
		const btTransform& childTrans = compoundShape->getChildTransform(index);
		btTransform	newChildWorldTrans = orgTrans*childTrans ;

		//perform an AABB check first
		btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;
		childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
		{

			btCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap,childShape,m_compoundColObjWrap->getCollisionObject(),newChildWorldTrans,-1,index);


			//the contactpoint is still projected back using the original inverted worldtrans
			if (!m_childCollisionAlgorithms[index])
				m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap,m_otherObjWrap,m_sharedManifold);

			
			const btCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1,index);
			} else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1,index);
			}


			m_childCollisionAlgorithms[index]->processCollision(&compoundWrap,m_otherObjWrap,m_dispatchInfo,m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & btIDebugDraw::DBG_DrawAabb))
			{
				btVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,btVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,btVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			} else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			
		}
	}